

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_spacing(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_t len;
  bson_t d;
  long local_188 [47];
  
  local_188[0xf] = 0;
  local_188[0x10] = 0;
  local_188[0xd] = 0;
  local_188[0xe] = 0;
  local_188[0xb] = 0;
  local_188[0xc] = 0;
  local_188[9] = 0;
  local_188[10] = 0;
  local_188[7] = 0;
  local_188[8] = 0;
  local_188[5] = 0;
  local_188[6] = 0;
  local_188[3] = 0;
  local_188[4] = 0;
  local_188[1] = 0x500000003;
  local_188[2] = 5;
  pcVar2 = (char *)bson_as_json(local_188 + 1,local_188);
  iVar1 = strcmp(pcVar2,"{ }");
  if (iVar1 == 0) {
    if (local_188[0] == 3) {
      bson_free(pcVar2);
      bson_append_int32(local_188 + 1,"a",1);
      pcVar2 = (char *)bson_as_json(local_188 + 1,local_188);
      iVar1 = strcmp(pcVar2,"{ \"a\" : 1 }");
      if (iVar1 == 0) {
        if (local_188[0] == 0xb) {
          bson_free(pcVar2);
          bson_destroy(local_188 + 1);
          return;
        }
        pcVar2 = "len == 11";
        uVar3 = 0xa86;
      }
      else {
        pcVar2 = "0 == strcmp (str, \"{ \\\"a\\\" : 1 }\")";
        uVar3 = 0xa85;
      }
    }
    else {
      pcVar2 = "len == 3";
      uVar3 = 0xa80;
    }
  }
  else {
    pcVar2 = "0 == strcmp (str, \"{ }\")";
    uVar3 = 0xa7f;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_as_json_spacing",pcVar2);
  abort();
}

Assistant:

static void
test_bson_as_json_spacing (void)
{
   bson_t d = BSON_INITIALIZER;
   size_t len;
   char *str;

   str = bson_as_json (&d, &len);
   BSON_ASSERT (0 == strcmp (str, "{ }"));
   BSON_ASSERT (len == 3);
   bson_free (str);

   BSON_APPEND_INT32 (&d, "a", 1);
   str = bson_as_json (&d, &len);
   BSON_ASSERT (0 == strcmp (str, "{ \"a\" : 1 }"));
   BSON_ASSERT (len == 11);
   bson_free (str);

   bson_destroy (&d);
}